

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::BasicTexImageCubeCase::createTexture(BasicTexImageCubeCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 format;
  deUint32 type;
  uint uVar3;
  deUint32 dVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int ndx;
  long lVar9;
  int face;
  long lVar10;
  float fVar11;
  uint local_100;
  deUint32 tex;
  int local_f0;
  int local_ec;
  BasicTexImageCubeCase *local_e8;
  ulong local_e0;
  Vec4 gMax;
  TextureFormat fmt;
  Vec4 gMin;
  PixelBufferAccess local_a8;
  TextureLevel levelData;
  float local_58 [6];
  Random rnd;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  local_100 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar5 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar7 = 0x20;
    if (uVar5 != 0) {
      uVar7 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    uVar5 = (this->super_TextureSpecCase).m_height;
    if (uVar5 != 0) {
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar8 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar7)) {
      iVar8 = 0x1f - uVar7;
    }
    local_100 = iVar8 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  if (local_100 != 0) {
    uVar6 = 0;
    local_e8 = this;
    do {
      local_ec = (local_e8->super_TextureSpecCase).m_width >> ((byte)uVar6 & 0x1f);
      if (local_ec < 2) {
        local_ec = 1;
      }
      local_f0 = (local_e8->super_TextureSpecCase).m_height >> ((byte)uVar6 & 0x1f);
      if (local_f0 < 2) {
        local_f0 = 1;
      }
      local_e0 = uVar6;
      tcu::TextureLevel::setSize(&levelData,local_ec,local_f0,1);
      lVar10 = 0;
      do {
        local_a8.super_ConstPixelBufferAccess.m_format.order = R;
        local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        gMax.m_data[0] = 1.0;
        gMax.m_data[1] = 1.0;
        gMax.m_data[2] = 1.0;
        gMax.m_data[3] = 1.0;
        gMin.m_data[0] = 0.0;
        gMin.m_data[1] = 0.0;
        gMin.m_data[2] = 0.0;
        gMin.m_data[3] = 0.0;
        lVar9 = 0;
        do {
          fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2];
          fVar2 = gMax.m_data[lVar9];
          fVar11 = deRandom_getFloat(&rnd.m_rnd);
          gMin.m_data[lVar9] = (fVar2 - fVar1) * fVar11 + fVar1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        local_a8.super_ConstPixelBufferAccess.m_format.order = R;
        local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        local_58[0] = 1.0;
        local_58[1] = 1.0;
        local_58[2] = 1.0;
        local_58[3] = 1.0;
        gMax.m_data[0] = 0.0;
        gMax.m_data[1] = 0.0;
        gMax.m_data[2] = 0.0;
        gMax.m_data[3] = 0.0;
        lVar9 = 0;
        do {
          fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2];
          fVar2 = local_58[lVar9];
          fVar11 = deRandom_getFloat(&rnd.m_rnd);
          gMax.m_data[lVar9] = (fVar2 - fVar1) * fVar11 + fVar1;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        tcu::TextureLevel::getAccess(&local_a8,&levelData);
        tcu::fillWithComponentGradients(&local_a8,&gMin,&gMax);
        dVar4 = (&s_cubeMapFaces)[lVar10];
        format = local_e8->m_format;
        type = local_e8->m_dataType;
        tcu::TextureLevel::getAccess(&local_a8,&levelData);
        sglr::ContextWrapper::glTexImage2D
                  (this_00,dVar4,(int)local_e0,format,local_ec,local_f0,0,format,type,
                   local_a8.super_ConstPixelBufferAccess.m_data);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      uVar5 = (int)local_e0 + 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != local_100);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			levelData.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
			}
		}
	}